

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdpp.cxx
# Opt level: O0

bool __thiscall GD::Image::CreateFrom(Image *this,istream *in)

{
  int iVar1;
  undefined1 local_19;
  bool rtn;
  istream *in_local;
  Image *this_local;
  
  iVar1 = std::istream::peek();
  if (iVar1 == 0) {
    local_19 = CreateFromWBMP(this,in);
  }
  else if (iVar1 == 0x47) {
    local_19 = CreateFromGif(this,in);
  }
  else if (iVar1 == 0x67) {
    local_19 = CreateFromGd2(this,in);
  }
  else {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool Image::CreateFrom(std::istream & in)
		{
		bool rtn;
		switch (in.peek())
			{
#ifdef HAVE_LIBPNG
		/* PNG
		The first eight bytes of a PNG file always contain the following (decimal) values:
		   0x89 0x50 0x4E 0x47 0x0D 0x0A 0x1A 0x0A
		   == .PNG\r\n.\n
		*/
		case 0x89: // PNG
			rtn = CreateFromPng(in);
			break;
#endif

		/* GIF
			0x47 0x49 0x46
		*/
		case 0x47: // GIF
			rtn = CreateFromGif(in);
			break;

#ifdef HAVE_LIBJPEG
		/* JPEG
		A JFIF-standard file will start with the four bytes (hex) FF D8 FF E0,
		    followed by two variable bytes (often hex 00 10), followed by 'JFIF'.		
		*/
		case 0xFF: // JPEG
			rtn = CreateFromJpeg(in);
			break;
#endif

		/* WBMP
		WBMP Type 0: B/W, Uncompressed bitmap is the only gd supported type		
		*/
		case 0x00: // WBMP
			rtn = CreateFromWBMP(in);
			break;
		/* GD2
			0x67 0x64 0x32 0x00 
			== GD2\0
		Starts with gd2 
		*/
		case 0x67: // GD2
			rtn = CreateFromGd2(in);
			break;
		/* GD
			0xFF 0xFE
			or 
			0xFF 0xFF 
			Conflicts with Jpeg
		*/
		default:
			rtn = false;
			break;
			}
		return rtn; 
		}